

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_newc.c
# Opt level: O1

int write_header(archive_write *a,archive_entry *entry)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  wchar_t wVar4;
  uint uVar5;
  mode_t mVar6;
  int iVar7;
  archive_string_conv *sc;
  int *piVar8;
  char *pcVar9;
  dev_t dVar10;
  int64_t iVar11;
  void *pvVar12;
  time_t v;
  size_t sVar13;
  uint *puVar14;
  char *pcVar15;
  long lVar16;
  long lVar17;
  int64_t *piVar18;
  ulong uVar19;
  size_t length;
  size_t len;
  char *p;
  char *path;
  char h [76];
  int local_b4;
  size_t local_b0;
  int64_t *local_a8;
  char *local_a0;
  size_t local_98;
  char *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  piVar18 = (int64_t *)a->format_data;
  sc = get_sconv(a);
  wVar4 = _archive_entry_pathname_l(entry,&local_90,&local_b0,sc);
  uVar19 = 0;
  local_b4 = 0;
  if (wVar4 == L'\0') {
LAB_0018cb7d:
    local_98 = local_b0;
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    uStack_48 = 0;
    uStack_44 = 0;
    format_octal(0x71c7,&local_88,6);
    dVar10 = archive_entry_dev(entry);
    format_octal(dVar10,(void *)((long)&local_88 + 6),6);
    iVar11 = archive_entry_ino64(entry);
    if (iVar11 != 0) {
      uVar5 = archive_entry_nlink(entry);
      if (uVar5 < 2) {
        uVar19 = piVar18[1] + 1;
        piVar18[1] = uVar19;
      }
      else {
        uVar1 = piVar18[4];
        if (uVar1 != 0) {
          puVar14 = (uint *)(piVar18[2] + 8);
          uVar19 = uVar1;
          do {
            if (*(long *)(puVar14 + -2) == iVar11) {
              uVar19 = (ulong)*puVar14;
              goto LAB_0018cca5;
            }
            puVar14 = puVar14 + 4;
            uVar19 = uVar19 - 1;
          } while (uVar19 != 0);
        }
        uVar2 = piVar18[3];
        uVar19 = piVar18[1] + 1;
        piVar18[1] = uVar19;
        if (uVar2 <= uVar1) {
          lVar17 = uVar2 * 2;
          if (uVar2 < 0x200) {
            lVar17 = 0x200;
          }
          local_a8 = piVar18;
          pvVar12 = realloc((void *)piVar18[2],lVar17 << 4);
          piVar18 = local_a8;
          if (pvVar12 == (void *)0x0) {
            uVar19 = 0xffffffff;
            goto LAB_0018cca5;
          }
          local_a8[3] = lVar17;
          local_a8[2] = (int64_t)pvVar12;
        }
        lVar17 = piVar18[2];
        lVar3 = piVar18[4];
        lVar16 = lVar3 * 0x10;
        *(int64_t *)(lVar17 + lVar16) = iVar11;
        *(int *)(lVar17 + 8 + lVar16) = (int)uVar19;
        piVar18[4] = lVar3 + 1;
      }
    }
LAB_0018cca5:
    uVar5 = (uint)uVar19;
    if ((int)uVar5 < 0) {
      pcVar15 = "No memory for ino translation table";
    }
    else {
      if (0x3ffff < (int)uVar5) {
        pcVar15 = "Too many files for this cpio format";
        iVar7 = 0x22;
        goto LAB_0018ce0f;
      }
      format_octal((ulong)(uVar5 & 0x3ffff),(void *)((long)&uStack_80 + 4),6);
      mVar6 = archive_entry_mode(entry);
      format_octal((ulong)mVar6,(void *)((long)&local_78 + 2),6);
      iVar11 = archive_entry_uid(entry);
      format_octal(iVar11,&uStack_70,6);
      iVar11 = archive_entry_gid(entry);
      format_octal(iVar11,(void *)((long)&uStack_70 + 6),6);
      uVar5 = archive_entry_nlink(entry);
      format_octal((ulong)uVar5,(void *)((long)&local_68 + 4),6);
      mVar6 = archive_entry_filetype(entry);
      if ((mVar6 == 0x6000) || (mVar6 = archive_entry_filetype(entry), mVar6 == 0x2000)) {
        dVar10 = archive_entry_dev(entry);
      }
      else {
        dVar10 = 0;
      }
      format_octal(dVar10,(void *)((long)&uStack_60 + 2),6);
      v = archive_entry_mtime(entry);
      format_octal(v,&local_58,0xb);
      length = (size_t)((int)local_98 + 1);
      format_octal(length,(void *)((long)&uStack_50 + 3),6);
      mVar6 = archive_entry_filetype(entry);
      if (mVar6 != 0x8000) {
        archive_entry_set_size(entry,0);
      }
      wVar4 = _archive_entry_symlink_l(entry,&local_a0,&local_b0,sc);
      if (wVar4 == L'\0') {
LAB_0018ce66:
        if ((local_a0 == (char *)0x0 || local_b0 == 0) || (*local_a0 == '\0')) {
          sVar13 = archive_entry_size(entry);
        }
        else {
          sVar13 = strlen(local_a0);
        }
        iVar7 = format_octal(sVar13,(void *)((long)&uStack_48 + 1),0xb);
        if (iVar7 != 0) {
          archive_set_error(&a->archive,0x22,"File is too large for cpio format.");
          return -0x19;
        }
        iVar7 = __archive_write_output(a,&local_88,0x4c);
        if (iVar7 != 0) {
          return -0x1e;
        }
        iVar7 = __archive_write_output(a,local_90,length);
        if (iVar7 != 0) {
          return -0x1e;
        }
        iVar11 = archive_entry_size(entry);
        *piVar18 = iVar11;
        if (local_a0 == (char *)0x0) {
          return local_b4;
        }
        if (*local_a0 == '\0') {
          return local_b4;
        }
        sVar13 = strlen(local_a0);
        iVar7 = __archive_write_output(a,local_a0,sVar13);
        if (iVar7 != 0) {
          return -0x1e;
        }
        return local_b4;
      }
      piVar8 = __errno_location();
      if (*piVar8 != 0xc) {
        pcVar15 = archive_entry_symlink(entry);
        pcVar9 = archive_string_conversion_charset_name(sc);
        archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar15,pcVar9);
        local_b4 = -0x14;
        goto LAB_0018ce66;
      }
      pcVar15 = "Can\'t allocate memory for Linkname";
    }
  }
  else {
    piVar8 = __errno_location();
    if (*piVar8 != 0xc) {
      pcVar15 = archive_entry_pathname(entry);
      pcVar9 = archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar15,pcVar9);
      local_b4 = -0x14;
      goto LAB_0018cb7d;
    }
    pcVar15 = "Can\'t allocate memory for Pathname";
  }
  iVar7 = 0xc;
LAB_0018ce0f:
  archive_set_error(&a->archive,iVar7,pcVar15);
  return -0x1e;
}

Assistant:

static int
write_header(struct archive_write *a, struct archive_entry *entry)
{
	int64_t ino;
	struct cpio *cpio;
	const char *p, *path;
	int pathlength, ret, ret_final;
	char h[c_header_size];
	struct archive_string_conv *sconv;
	struct archive_entry *entry_main;
	size_t len;
	int pad;

	cpio = (struct cpio *)a->format_data;
	ret_final = ARCHIVE_OK;
	sconv = get_sconv(a);

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pahtname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate ustar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif

	ret = archive_entry_pathname_l(entry, &path, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate pathname '%s' to %s",
		    archive_entry_pathname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}
	pathlength = (int)len + 1; /* Include trailing null. */

	memset(h, 0, c_header_size);
	format_hex(0x070701, h + c_magic_offset, c_magic_size);
	format_hex(archive_entry_devmajor(entry), h + c_devmajor_offset,
	    c_devmajor_size);
	format_hex(archive_entry_devminor(entry), h + c_devminor_offset,
	    c_devminor_size);

	ino = archive_entry_ino64(entry);
	if (ino > 0xffffffff) {
		archive_set_error(&a->archive, ERANGE,
		    "large inode number truncated");
		ret_final = ARCHIVE_WARN;
	}

	/* TODO: Set ret_final to ARCHIVE_WARN if any of these overflow. */
	format_hex(ino & 0xffffffff, h + c_ino_offset, c_ino_size);
	format_hex(archive_entry_mode(entry), h + c_mode_offset, c_mode_size);
	format_hex(archive_entry_uid(entry), h + c_uid_offset, c_uid_size);
	format_hex(archive_entry_gid(entry), h + c_gid_offset, c_gid_size);
	format_hex(archive_entry_nlink(entry), h + c_nlink_offset, c_nlink_size);
	if (archive_entry_filetype(entry) == AE_IFBLK
	    || archive_entry_filetype(entry) == AE_IFCHR) {
	    format_hex(archive_entry_rdevmajor(entry), h + c_rdevmajor_offset, c_rdevmajor_size);
	    format_hex(archive_entry_rdevminor(entry), h + c_rdevminor_offset, c_rdevminor_size);
	} else {
	    format_hex(0, h + c_rdevmajor_offset, c_rdevmajor_size);
	    format_hex(0, h + c_rdevminor_offset, c_rdevminor_size);
	}
	format_hex(archive_entry_mtime(entry), h + c_mtime_offset, c_mtime_size);
	format_hex(pathlength, h + c_namesize_offset, c_namesize_size);
	format_hex(0, h + c_checksum_offset, c_checksum_size);

	/* Non-regular files don't store bodies. */
	if (archive_entry_filetype(entry) != AE_IFREG)
		archive_entry_set_size(entry, 0);

	/* Symlinks get the link written as the body of the entry. */
	ret = archive_entry_symlink_l(entry, &p, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Likname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate linkname '%s' to %s",
		    archive_entry_symlink(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}
	if (len > 0 && p != NULL  &&  *p != '\0')
		ret = format_hex(strlen(p), h + c_filesize_offset,
		    c_filesize_size);
	else
		ret = format_hex(archive_entry_size(entry),
		    h + c_filesize_offset, c_filesize_size);
	if (ret) {
		archive_set_error(&a->archive, ERANGE,
		    "File is too large for this format.");
		ret_final = ARCHIVE_FAILED;
		goto exit_write_header;
	}

	ret = __archive_write_output(a, h, c_header_size);
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}

	/* Pad pathname to even length. */
	ret = __archive_write_output(a, path, pathlength);
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}
	pad = PAD4(pathlength + c_header_size);
	if (pad) {
		ret = __archive_write_output(a, "\0\0\0", pad);
		if (ret != ARCHIVE_OK) {
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
	}

	cpio->entry_bytes_remaining = archive_entry_size(entry);
	cpio->padding = (int)PAD4(cpio->entry_bytes_remaining);

	/* Write the symlink now. */
	if (p != NULL  &&  *p != '\0') {
		ret = __archive_write_output(a, p, strlen(p));
		if (ret != ARCHIVE_OK) {
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		pad = PAD4(strlen(p));
		ret = __archive_write_output(a, "\0\0\0", pad);
		if (ret != ARCHIVE_OK) {
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
	}
exit_write_header:
	if (entry_main)
		archive_entry_free(entry_main);
	return (ret_final);
}